

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_getColsByMask(void *highs,HighsInt *mask,HighsInt *num_col,double *costs,
                            double *lower,double *upper,HighsInt *num_nz,HighsInt *matrix_start,
                            HighsInt *matrix_index,double *matrix_value)

{
  HighsStatus HVar1;
  undefined4 *in_RDX;
  undefined4 *in_stack_00000008;
  HighsStatus status;
  HighsInt local_num_nz;
  HighsInt local_num_col;
  undefined4 local_40;
  undefined4 local_3c;
  
  HVar1 = Highs::getCols((Highs *)highs,mask,num_col,costs,lower,upper,num_nz,matrix_start,
                         matrix_index,matrix_value);
  *in_RDX = local_3c;
  *in_stack_00000008 = local_40;
  return HVar1;
}

Assistant:

HighsInt Highs_getColsByMask(const void* highs, const HighsInt* mask,
                             HighsInt* num_col, double* costs, double* lower,
                             double* upper, HighsInt* num_nz,
                             HighsInt* matrix_start, HighsInt* matrix_index,
                             double* matrix_value) {
  HighsInt local_num_col, local_num_nz;
  HighsStatus status =
      ((Highs*)highs)
          ->getCols(mask, local_num_col, costs, lower, upper, local_num_nz,
                    matrix_start, matrix_index, matrix_value);
  *num_col = local_num_col;
  *num_nz = local_num_nz;
  return (HighsInt)status;
}